

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize
          (BerdySparseMAPSolverPimpl *this)

{
  BerdyHelper *this_00;
  bool bVar1;
  size_t rows;
  size_t sVar2;
  size_t sVar3;
  Triplets identityTriplets;
  FrameIndex local_50;
  Vector3 initialGravity;
  
  this->valid = false;
  bVar1 = BerdyHelper::isValid(this->berdy);
  if (bVar1) {
    rows = BerdyHelper::getNrOfDynamicVariables(this->berdy);
    sVar2 = BerdyHelper::getNrOfDynamicEquations(this->berdy);
    sVar3 = BerdyHelper::getNrOfSensorsMeasurements(this->berdy);
    BerdyHelper::model(this->berdy);
    iDynTree::JointPosDoubleArray::resize((Model *)&this->jointsConfiguration);
    iDynTree::VectorDynSize::zero();
    BerdyHelper::model(this->berdy);
    iDynTree::JointDOFsDoubleArray::resize((Model *)&this->jointsVelocity);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->measurements);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsAPosteriori);
    iDynTree::VectorDynSize::zero();
    Eigen::SparseMatrix<double,_0,_int>::resize
              (&this->covarianceDynamicsAPosterioriInverse,rows,rows);
    Eigen::SparseMatrix<double,_0,_int>::resize(&this->covarianceDynamicsPriorInverse,rows,rows);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsPrior);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsPriorRHS);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsAPosterioriRHS);
    iDynTree::VectorDynSize::zero();
    identityTriplets.m_triplets.
    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    identityTriplets.m_triplets.
    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    identityTriplets.m_triplets.
    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorDynamicsConstraintsCovarianceInverse,sVar2);
    iDynTree::Triplets::reserve((ulong)&identityTriplets);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&identityTriplets,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorDynamicsConstraintsCovarianceInverse);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorDynamicsRegularizationCovarianceInverse,rows);
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&identityTriplets);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&identityTriplets,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorDynamicsRegularizationCovarianceInverse);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorMeasurementsCovarianceInverse,sVar3);
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&identityTriplets);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&identityTriplets,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorMeasurementsCovarianceInverse);
    iDynTree::VectorDynSize::resize((ulong)&this->priorDynamicsRegularizationExpectedValue);
    iDynTree::VectorDynSize::zero();
    VectorFixSize<3U>::zero(&initialGravity);
    initialGravity.m_data[2] = -9.81;
    this_00 = this->berdy;
    BerdyHelper::dynamicTraversal(this_00);
    iDynTree::Traversal::getBaseLink();
    local_50 = iDynTree::Link::getIndex();
    BerdyHelper::updateKinematicsFromFixedBase
              (this_00,&this->jointsConfiguration,&this->jointsVelocity,&local_50,&initialGravity);
    computeMAP(this,true);
    this->valid = true;
    std::_Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::~_Vector_base
              ((_Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *)
               &identityTriplets);
  }
  return bVar1;
}

Assistant:

bool BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize()
    {
        valid = false;
        if (!berdy.isValid()) return false;
        // Resize internal variables
        size_t numberOfDynVariables = berdy.getNrOfDynamicVariables();
        size_t numberOfDynEquations = berdy.getNrOfDynamicEquations();
        size_t numberOfMeasurements = berdy.getNrOfSensorsMeasurements();

        jointsConfiguration.resize(berdy.model());
        jointsConfiguration.zero();
        jointsVelocity.resize(berdy.model());
        jointsVelocity.zero();

        measurements.resize(numberOfMeasurements);
        measurements.zero();

        expectedDynamicsAPosteriori.resize(numberOfDynVariables);
        expectedDynamicsAPosteriori.zero();
        covarianceDynamicsAPosterioriInverse.resize(numberOfDynVariables, numberOfDynVariables);

        covarianceDynamicsPriorInverse.resize(numberOfDynVariables, numberOfDynVariables);
        expectedDynamicsPrior.resize(numberOfDynVariables);
        expectedDynamicsPriorRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.zero();

        // Resize priors and set them to identity.
        // If a prior is specified in config file they will be cleared after
        iDynTree::Triplets identityTriplets;
        priorDynamicsConstraintsCovarianceInverse.resize(numberOfDynEquations, numberOfDynEquations);
        identityTriplets.reserve(numberOfDynEquations);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynEquations);
        priorDynamicsConstraintsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationCovarianceInverse.resize(numberOfDynVariables, numberOfDynVariables);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfDynVariables);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynVariables);
        priorDynamicsRegularizationCovarianceInverse.setFromTriplets(identityTriplets);

        priorMeasurementsCovarianceInverse.resize(numberOfMeasurements, numberOfMeasurements);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfMeasurements);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfMeasurements);
        priorMeasurementsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationExpectedValue.resize(numberOfDynVariables);
        priorDynamicsRegularizationExpectedValue.zero();

        Vector3 initialGravity;
        initialGravity.zero();
        initialGravity(2) = -9.81;

        berdy.updateKinematicsFromFixedBase(jointsConfiguration, jointsVelocity, berdy.dynamicTraversal().getBaseLink()->getIndex(), initialGravity);
        computeMAP(true);

        valid = true;
        return true;
    }